

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrlist.h
# Opt level: O3

void __thiscall icu_63::NFRuleList::~NFRuleList(NFRuleList *this)

{
  NFRule *this_00;
  void *in_RSI;
  NFRule **buffer;
  ulong uVar1;
  
  buffer = this->fStuff;
  if (buffer != (NFRule **)0x0) {
    if (this->fCount != 0) {
      uVar1 = 0;
      do {
        this_00 = this->fStuff[uVar1];
        if (this_00 != (NFRule *)0x0) {
          NFRule::~NFRule(this_00);
        }
        UMemory::operator_delete((UMemory *)this_00,in_RSI);
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->fCount);
      buffer = this->fStuff;
    }
    uprv_free_63(buffer);
  }
  return;
}

Assistant:

~NFRuleList() {
        if (fStuff) {
            for(uint32_t i = 0; i < fCount; ++i) {
                delete fStuff[i];
            }
            uprv_free(fStuff);
        }
    }